

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryPropertyDescriptor.h
# Opt level: O3

bool __thiscall
Js::DictionaryPropertyDescriptor<unsigned_short>::ConvertToGetterSetter
          (DictionaryPropertyDescriptor<unsigned_short> *this,unsigned_short *nextPropertyIndex)

{
  Flags FVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  unsigned_short uVar5;
  undefined4 *puVar6;
  
  FVar1 = this->flags;
  if ((FVar1 & IsAccessor) == None) {
    this->flags = FVar1 | IsAccessor;
    if ((this->Attributes & 0x10) == 0) {
      if (this->Data == 0xffff) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                    ,0x12f,"(this->Data != NoSlots)","this->Data != NoSlots");
        if (!bVar3) goto LAB_00da0a43;
        *puVar6 = 0;
      }
      if (this->Getter != 0xffff) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                    ,0x130,"(this->Getter == NoSlots)","this->Getter == NoSlots");
        if (!bVar3) goto LAB_00da0a43;
        *puVar6 = 0;
      }
      this->Getter = this->Data;
      this->Data = 0xffff;
    }
    else if ((FVar1 & IsShadowed) == None) {
      this->flags = FVar1 | (IsAccessor|IsShadowed);
    }
    else if (this->Getter == 0xffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                  ,0x124,"(this->Getter != NoSlots)","this->Getter != NoSlots");
      if (!bVar3) goto LAB_00da0a43;
      *puVar6 = 0;
    }
    bVar3 = this->Getter == 0xffff;
    if (bVar3) {
      uVar5 = *nextPropertyIndex;
      if (uVar5 == 0xffff) goto LAB_00da0a45;
      *nextPropertyIndex = uVar5 + 1;
      this->Getter = uVar5;
    }
    if (this->Setter == 0xffff) {
      uVar5 = *nextPropertyIndex;
      if (uVar5 == 0xffff) {
LAB_00da0a45:
        ::Math::DefaultOverflowPolicy();
      }
      *nextPropertyIndex = uVar5 + 1;
      this->Setter = uVar5;
      bVar3 = true;
    }
    uVar5 = GetGetterPropertyIndex(this);
    if (uVar5 != 0xffff) {
      return bVar3;
    }
    uVar5 = GetSetterPropertyIndex(this);
    if (uVar5 != 0xffff) {
      return bVar3;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                ,0x140,
                                "(this->GetGetterPropertyIndex() != NoSlots || this->GetSetterPropertyIndex() != NoSlots)"
                                ,
                                "this->GetGetterPropertyIndex() != NoSlots || this->GetSetterPropertyIndex() != NoSlots"
                               );
    if (!bVar4) {
LAB_00da0a43:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  else {
    if ((this->Getter != 0xffff) && (this->Setter != 0xffff)) {
      return false;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                ,0x11a,"(this->Getter != NoSlots && this->Setter != NoSlots)",
                                "this->Getter != NoSlots && this->Setter != NoSlots");
    if (!bVar3) goto LAB_00da0a43;
    bVar3 = false;
  }
  *puVar6 = 0;
  return bVar3;
}

Assistant:

bool DictionaryPropertyDescriptor<TPropertyIndex>::ConvertToGetterSetter(TPropertyIndex& nextPropertyIndex)
    {
        // Initial descriptor state and corresponding conversion can be one of the following:
        //
        // | State                              | Data    | Getter   | Setter   | Conversion                                                                                        |
        // |------------------------------------|---------|----------|----------|---------------------------------------------------------------------------------------------------|
        // | Data property                      | valid   | NoSlots? | NoSlots? | Move Data to Getter, set Data to NoSlots, create new slot for Setter if necessary, set IsAccessor |
        // | LetConstGlobal                     | valid   | NoSlots? | NoSlots? | Create new slots for Getter and Setter if necessary, set IsAccessor, set IsShadowed               |
        // | Data property + LetConstGlobal     | valid   | valid    | NoSlots? | Create new slot for Setter if necessary, set IsAccessor                                           |
        // | Accessor property                  | NoSlots | valid    | valid    | Nothing                                                                                           |
        // | Accessor property + LetConstGlobal | valid   | valid    | valid    | Nothing                                                                                           |
        // |------------------------------------|---------|----------|----------|---------------------------------------------------------------------------------------------------|
        //
        // NOTE: Do not create slot for Getter/Setter if they are already valid; possible after previous conversion from Accessor to Data, or deletion of Accessor, etc.

        if (GetIsAccessor())
        {
            // Accessor property
            // Accessor property + LetConstGlobal
            Assert(this->Getter != NoSlots && this->Setter != NoSlots);
            return false;
        }

        SetIsAccessor(true);
        if (this->Attributes & PropertyLetConstGlobal)
        {
            if (GetIsShadowed())
            {
                // Data property + LetConstGlobal
                Assert(this->Getter != NoSlots);
            }
            else
            {
                // LetConstGlobal
                SetIsShadowed(true);
            }
        }
        else
        {
            // Data property
            Assert(this->Data != NoSlots);
            Assert(this->Getter == NoSlots);
            this->Getter = this->Data;
            this->Data = NoSlots;
        }

        bool addedPropertyIndex = false;
        if (this->Getter == NoSlots)
        {
            this->Getter = ::Math::PostInc(nextPropertyIndex);
            addedPropertyIndex = true;
        }
        if (this->Setter == NoSlots)
        {
            this->Setter = ::Math::PostInc(nextPropertyIndex);
            addedPropertyIndex = true;
        }
        Assert(this->GetGetterPropertyIndex() != NoSlots || this->GetSetterPropertyIndex() != NoSlots);
        return addedPropertyIndex;
    }